

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O2

void __thiscall Listener::doLoop(Listener *this,actor_ref *param_1,msg_loop *param_2)

{
  msg_loop local_11;
  actor_ref local_10;
  
  if ((this->super_actor).field_0x51 == '\x01') {
    this->m_counter = this->m_counter + 1;
    acto::actor_ref::actor_ref(&local_10,&(this->super_actor).self_);
    acto::actor_ref::send<msg_loop>(&local_10,&local_11);
    acto::actor_ref::~actor_ref(&local_10);
  }
  return;
}

Assistant:

void doLoop(acto::actor_ref, const msg_loop&) {
    if (m_active) {
      m_counter++;
      // Продолжить цикл
      self().send(msg_loop());
    }
  }